

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  _Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *p_Var1;
  pointer pcVar2;
  char *__s;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  ostream *poVar6;
  FILE *pFVar7;
  size_t __n;
  uint *puVar8;
  int err;
  int err_00;
  byte bVar9;
  long lVar10;
  _Alloc_hider _Var11;
  _Alloc_hider _Var12;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Alloc_hider __it_00;
  _Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *p_Var13;
  size_type sVar14;
  LogMessageData *pLVar15;
  allocator<char> local_4da;
  allocator<char> local_4d9;
  string s;
  undefined1 local_4b0 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  char *local_430;
  string logmailer;
  string cmd;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  LogMessageData *local_3a8 [4];
  string local_388;
  string local_368;
  string local_348;
  ostringstream sanitized_dests;
  istringstream ss;
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sanitized_dests,dest,(allocator<char> *)local_4b0);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&ss,(string *)&sanitized_dests,_S_in);
    local_430 = body;
    std::__cxx11::string::~string((string *)&sanitized_dests);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&sanitized_dests);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    while( true ) {
      __it._M_current = (char *)&s;
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ss,(string *)__it._M_current,',');
      __it_00 = s._M_dataplus;
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      p_Var1 = (_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
               (s._M_dataplus._M_p + s._M_string_length);
      _Var11 = s._M_dataplus;
      sVar14 = s._M_string_length;
      for (lVar10 = (long)s._M_string_length >> 2; 0 < lVar10; lVar10 = lVar10 + -1) {
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             _Var11._M_p,__it);
        p_Var13 = (_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)_Var11._M_p;
        if (bVar3) goto LAB_0010af37;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             _Var11._M_p + 1,__it);
        p_Var13 = (_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)_Var11._M_p +
                  1;
        if (bVar3) goto LAB_0010af37;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             _Var11._M_p + 2,__it);
        p_Var13 = (_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)_Var11._M_p +
                  2;
        if (bVar3) goto LAB_0010af37;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             _Var11._M_p + 3,__it);
        p_Var13 = (_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)_Var11._M_p +
                  3;
        if (bVar3) goto LAB_0010af37;
        _Var11._M_p = _Var11._M_p + 4;
        sVar14 = sVar14 - 4;
      }
      if (sVar14 == 1) {
LAB_0010b118:
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             _Var11._M_p,__it);
        p_Var13 = p_Var1;
        if (bVar3) {
          p_Var13 = (_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)_Var11._M_p
          ;
        }
      }
      else if (sVar14 == 2) {
LAB_0010af10:
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             _Var11._M_p,__it);
        p_Var13 = (_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)_Var11._M_p;
        if (!bVar3) {
          _Var11._M_p = _Var11._M_p + 1;
          goto LAB_0010b118;
        }
      }
      else {
        p_Var13 = p_Var1;
        if ((sVar14 == 3) &&
           (bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>::operator()
                              ((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                               _Var11._M_p,__it),
           p_Var13 = (_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                     _Var11._M_p, !bVar3)) {
          _Var11._M_p = _Var11._M_p + 1;
          goto LAB_0010af10;
        }
      }
LAB_0010af37:
      std::__cxx11::string::erase(&s,__it_00._M_p,p_Var13);
      _Var11 = s._M_dataplus;
      pcVar2 = s._M_dataplus._M_p + s._M_string_length;
      sVar14 = s._M_string_length;
      for (body = (char *)((long)s._M_string_length >> 2);
          pLVar15 = (LogMessageData *)(_Var11._M_p + sVar14), _Var12._M_p = (pointer)pLVar15,
          0 < (long)body; body = &((LogMessageData *)((long)body + -0x76e8))->field_0x76e7) {
        local_4b0._0_8_ = pLVar15;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             local_4b0,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
        if (bVar3) goto LAB_0010b074;
        local_3a8[0] = (LogMessageData *)(_Var11._M_p + (sVar14 - 1));
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             local_3a8,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
        _Var12._M_p = _Var11._M_p + (sVar14 - 1);
        if (bVar3) goto LAB_0010b074;
        logmailer._M_dataplus._M_p = _Var11._M_p + (sVar14 - 2);
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             &logmailer,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
        _Var12._M_p = (pointer)(_Var11._M_p + (sVar14 - 2));
        if (bVar3) goto LAB_0010b074;
        cmd._M_dataplus._M_p = _Var11._M_p + (sVar14 - 3);
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             &cmd,(reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)__it_00._M_p);
        _Var12._M_p = (pointer)(_Var11._M_p + (sVar14 - 3));
        if (bVar3) goto LAB_0010b074;
        sVar14 = sVar14 - 4;
      }
      if (sVar14 == 3) {
        local_450._M_dataplus._M_p = (pointer)pLVar15;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             &local_450,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
        if (!bVar3) {
          pLVar15 = (LogMessageData *)(_Var11._M_p + 2);
          goto LAB_0010b037;
        }
      }
      else {
        if (sVar14 == 2) {
LAB_0010b037:
          local_3c8._M_dataplus._M_p = (pointer)pLVar15;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>::operator()
                            ((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             &local_3c8,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
          _Var12._M_p = (pointer)pLVar15;
          if (bVar3) goto LAB_0010b074;
          pLVar15 = (LogMessageData *)&pLVar15[-1].field_0x76e7;
        }
        else {
          _Var12 = _Var11;
          if (sVar14 != 1) goto LAB_0010b074;
        }
        local_3e8._M_dataplus._M_p = (pointer)pLVar15;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<google::trim(std::__cxx11::string&)::{lambda(char)#1}>
                ::operator()((_Iter_pred<google::trim(std::__cxx11::string&)::_lambda(char)_1_> *)
                             &local_3e8,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
        _Var12 = _Var11;
        if (bVar3) {
          _Var12._M_p = (pointer)pLVar15;
        }
      }
LAB_0010b074:
      std::__cxx11::string::erase(&s,_Var12._M_p,pcVar2);
      if (s._M_string_length != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_4b0,
                   "^[a-zA-Z0-9][a-zA-Z0-9.!#$%&\'*+/=?^_`{|}~-]*@[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?(?:\\.[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$"
                   ,0x10);
        bVar3 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (&s,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_4b0,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_4b0);
        if (!bVar3) {
          if (use_logging) {
            if (SendEmailInternal::vlocal__.level == (int32 *)0x0) {
              bVar3 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                                  ,1);
              if (bVar3) goto LAB_0010b3f7;
            }
            else if (0 < *SendEmailInternal::vlocal__.level) {
LAB_0010b3f7:
              LogMessage::LogMessage
                        ((LogMessage *)local_4b0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                         ,0x88e);
              poVar6 = std::operator<<((ostream *)(local_4b0._8_8_ + 0x7538),
                                       "Invalid destination email address:");
              std::operator<<(poVar6,(string *)&s);
              LogMessage::~LogMessage((LogMessage *)local_4b0);
            }
          }
          else {
            fprintf(_stderr,"Invalid destination email address: %s\n",s._M_dataplus._M_p);
          }
          bVar3 = false;
          bVar9 = 0;
          goto LAB_0010b60b;
        }
        std::__cxx11::stringbuf::str();
        body = (char *)local_4b0._8_8_;
        std::__cxx11::string::~string((string *)local_4b0);
        if ((LogMessageData *)body != (LogMessageData *)0x0) {
          std::operator<<((ostream *)&sanitized_dests,",");
        }
        std::operator<<((ostream *)&sanitized_dests,(string *)&s);
      }
    }
    std::__cxx11::stringbuf::str();
    pLVar15 = local_3a8[0];
    __s = local_430;
    if (use_logging) {
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level ==
          (int32 *)0x0) {
        bVar3 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                            ,1);
        if (bVar3) goto LAB_0010b1be;
      }
      else if (0 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level) {
LAB_0010b1be:
        LogMessage::LogMessage
                  ((LogMessage *)local_4b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x89e);
        poVar6 = std::operator<<((ostream *)(local_4b0._8_8_ + 0x7538),"Trying to send TITLE:");
        poVar6 = std::operator<<(poVar6,subject);
        poVar6 = std::operator<<(poVar6," BODY:");
        poVar6 = std::operator<<(poVar6,__s);
        poVar6 = std::operator<<(poVar6," to ");
        std::operator<<(poVar6,(char *)pLVar15);
        LogMessage::~LogMessage((LogMessage *)local_4b0);
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",subject,local_430,local_3a8[0]);
    }
    logmailer._M_dataplus._M_p = (pointer)&logmailer.field_2;
    logmailer._M_string_length = 0;
    logmailer.field_2._M_local_buf[0] = '\0';
    if (fLS::FLAGS_logmailer_buf_abi_cxx11_._8_8_ == 0) {
      std::__cxx11::string::assign((char *)&logmailer);
    }
    else {
      ShellEscape((string *)local_4b0,(string *)fLS::FLAGS_logmailer_buf_abi_cxx11_);
      body = local_4b0;
      std::__cxx11::string::operator=((string *)&logmailer,(string *)body);
      std::__cxx11::string::~string((string *)body);
    }
    bVar9 = (byte)body;
    std::operator+(&local_3c8,&logmailer," -s");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,subject,&local_4d9);
    ShellEscape(&local_3e8,&local_348);
    std::operator+(&local_450,&local_3c8,&local_3e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                   &local_450," ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,(char *)pLVar15,&local_4da);
    ShellEscape(&local_368,&local_388);
    std::operator+(&cmd,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4b0,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3c8);
    if (use_logging) {
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level ==
          (int32 *)0x0) {
        bVar3 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                            ,4);
        if (bVar3) goto LAB_0010b464;
      }
      else if (3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level) {
LAB_0010b464:
        LogMessage::LogMessage
                  ((LogMessage *)local_4b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x8b1);
        poVar6 = std::operator<<((ostream *)(local_4b0._8_8_ + 0x7538),"Mailing command: ");
        std::operator<<(poVar6,(string *)&cmd);
        LogMessage::~LogMessage((LogMessage *)local_4b0);
      }
    }
    pFVar7 = popen(cmd._M_dataplus._M_p,"w");
    bVar3 = pFVar7 == (FILE *)0x0;
    if (bVar3) {
      if (use_logging) {
        LogMessage::LogMessage
                  ((LogMessage *)local_4b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x8c7,ERROR);
        poVar6 = std::operator<<((ostream *)(local_4b0._8_8_ + 0x7538),"Unable to send mail to ");
        std::operator<<(poVar6,(char *)pLVar15);
        LogMessage::~LogMessage((LogMessage *)local_4b0);
      }
      else {
        fprintf(_stderr,"Unable to send mail to %s\n",pLVar15);
      }
    }
    else {
      if (__s != (char *)0x0) {
        __n = strlen(__s);
        fwrite(__s,1,__n,pFVar7);
      }
      iVar4 = pclose(pFVar7);
      pFVar7 = _stderr;
      bVar9 = 1;
      if (iVar4 == -1) {
        if (use_logging) {
          LogMessage::LogMessage
                    ((LogMessage *)local_4b0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                     ,0x8bd,ERROR);
          poVar6 = std::operator<<((ostream *)(local_4b0._8_8_ + 0x7538),"Problems sending mail to "
                                  );
          poVar6 = std::operator<<(poVar6,(char *)pLVar15);
          poVar6 = std::operator<<(poVar6,": ");
          puVar8 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_450,(google *)(ulong)*puVar8,err);
          std::operator<<(poVar6,(string *)&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          LogMessage::~LogMessage((LogMessage *)local_4b0);
          bVar9 = 0;
        }
        else {
          puVar8 = (uint *)__errno_location();
          StrError_abi_cxx11_((string *)local_4b0,(google *)(ulong)*puVar8,err_00);
          bVar9 = 0;
          fprintf(pFVar7,"Problems sending mail to %s: %s\n",pLVar15,local_4b0._0_8_);
          std::__cxx11::string::~string((string *)local_4b0);
        }
      }
    }
    std::__cxx11::string::~string((string *)&cmd);
    std::__cxx11::string::~string((string *)&logmailer);
    std::__cxx11::string::~string((string *)local_3a8);
LAB_0010b60b:
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sanitized_dests);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    if (!bVar3) goto LAB_0010b636;
  }
  bVar9 = 0;
LAB_0010b636:
  return (bool)(bVar9 & 1);
}

Assistant:

static bool SendEmailInternal(const char* dest, const char* subject,
                              const char* body, bool use_logging) {
#ifndef GLOG_OS_EMSCRIPTEN
  if (dest && *dest) {
    // Split the comma-separated list of email addresses, validate each one and
    // build a sanitized new comma-separated string without whitespace.
    std::istringstream ss(dest);
    std::ostringstream sanitized_dests;
    std::string s;
    while (std::getline(ss, s, ',')) {
      trim(s);
      if (s.empty()) {
        continue;
      }
      // We validate the provided email addresses using the same regular
      // expression that HTML5 uses[1], except that we require the address to
      // start with an alpha-numeric character. This is because we don't want to
      // allow email addresses that start with a special character, such as a
      // pipe or dash, which could be misunderstood as a command-line flag by
      // certain versions of `mail` that are vulnerable to command injection.[2]
      // [1]
      // https://html.spec.whatwg.org/multipage/input.html#valid-e-mail-address
      // [2] e.g. https://nvd.nist.gov/vuln/detail/CVE-2004-2771
      if (!std::regex_match(
              s,
              std::regex("^[a-zA-Z0-9]"
                         "[a-zA-Z0-9.!#$%&'*+/=?^_`{|}~-]*@[a-zA-Z0-9]"
                         "(?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?(?:\\.[a-zA-Z0-9]"
                         "(?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$"))) {
        if (use_logging) {
          VLOG(1) << "Invalid destination email address:" << s;
        } else {
          fprintf(stderr, "Invalid destination email address: %s\n", s.c_str());
        }
        return false;
      }
      if (!sanitized_dests.str().empty()) {
        sanitized_dests << ",";
      }
      sanitized_dests << s;
    }
    // Avoid dangling reference
    const std::string& tmp = sanitized_dests.str();
    dest = tmp.c_str();

    if (use_logging) {
      VLOG(1) << "Trying to send TITLE:" << subject << " BODY:" << body
              << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n", subject,
              body, dest);
    }

    string logmailer;

    if (FLAGS_logmailer.empty()) {
      // Don't need to shell escape the literal string
      logmailer = "/bin/mail";
    } else {
      logmailer = ShellEscape(FLAGS_logmailer);
    }

    string cmd =
        logmailer + " -s" + ShellEscape(subject) + " " + ShellEscape(dest);
    if (use_logging) {
      VLOG(4) << "Mailing command: " << cmd;
    }

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != nullptr) {
      // Add the body if we have one
      if (body) {
        fwrite(body, sizeof(char), strlen(body), pipe);
      }
      bool ok = pclose(pipe) != -1;
      if (!ok) {
        if (use_logging) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n", dest,
                  StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if (use_logging) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
#else
  (void)dest;
  (void)subject;
  (void)body;
  (void)use_logging;
  LOG(WARNING) << "Email support not available; not sending message";
#endif
  return false;
}